

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

lyd_node *
resolve_partial_json_data_nodeid
          (char *nodeid,char *llist_value,lyd_node *start,int options,int *parsed)

{
  ly_ctx *ctx_00;
  hash_table *phVar1;
  parsed_pred pp_00;
  parsed_pred pp_01;
  int iVar2;
  lys_node *plVar3;
  size_t sVar4;
  char *pcVar5;
  ushort **ppuVar6;
  lys_module *plVar7;
  lyd_node *local_f8;
  lys_node *local_f0;
  lyd_node *local_e8;
  lys_node *local_e0;
  parsed_pred pp;
  lys_node_list *slist;
  lys_node *sparent;
  lys_node *ssibling;
  ly_ctx *ctx;
  lys_module *prev_mod;
  lyd_node_leaf_list *llist;
  lyd_node *last_match;
  lyd_node *sibling;
  int local_80;
  int llval_len;
  int last_parsed;
  int has_predicate;
  int list_instance_position;
  int is_relative;
  int nam_len;
  int mod_name_len;
  int ret;
  int r;
  char *llval;
  char *data_val;
  char *name;
  char *mod_name;
  char *id;
  int *parsed_local;
  lyd_node *plStack_28;
  int options_local;
  lyd_node *start_local;
  char *llist_value_local;
  char *nodeid_local;
  
  has_predicate = -1;
  local_80 = 0;
  llist = (lyd_node_leaf_list *)0x0;
  id = (char *)parsed;
  parsed_local._4_4_ = options;
  plStack_28 = start;
  start_local = (lyd_node *)llist_value;
  llist_value_local = nodeid;
  if (((nodeid == (char *)0x0) || (start == (lyd_node *)0x0)) || (parsed == (int *)0x0)) {
    __assert_fail("nodeid && start && parsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0xa43,
                  "struct lyd_node *resolve_partial_json_data_nodeid(const char *, const char *, struct lyd_node *, int, int *)"
                 );
  }
  memset(&local_e0,0,0x18);
  ctx_00 = plStack_28->schema->module->ctx;
  mod_name = llist_value_local;
  mod_name_len = parse_schema_nodeid(llist_value_local,&name,&is_relative,&data_val,
                                     &list_instance_position,&has_predicate,(int *)0x0,(int *)0x0,1)
  ;
  if (mod_name_len < 1) {
    ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)mod_name[-mod_name_len],mod_name + -mod_name_len);
  }
  else {
    if (*data_val == '#') {
      if (has_predicate != 0) {
        ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,0x23,data_val);
        goto LAB_00119795;
      }
      mod_name = mod_name + mod_name_len;
      local_80 = mod_name_len;
    }
    else {
      has_predicate = -1;
    }
    mod_name_len = parse_schema_nodeid(mod_name,&name,&is_relative,&data_val,&list_instance_position
                                       ,&has_predicate,&llval_len,(int *)0x0,0);
    if (0 < mod_name_len) {
      mod_name = mod_name + mod_name_len;
      local_80 = mod_name_len + local_80;
      if (has_predicate == 0) {
        for (; plStack_28->parent != (lyd_node *)0x0; plStack_28 = plStack_28->parent) {
        }
        ctx = (ly_ctx *)lyd_node_module(plStack_28);
      }
      else {
        ctx = (ly_ctx *)lyd_node_module(plStack_28);
        if ((plStack_28->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER))
            == LYS_UNKNOWN) {
          local_e8 = (lyd_node *)0x0;
        }
        else {
          local_e8 = plStack_28->child;
        }
        plStack_28 = local_e8;
      }
      if (plStack_28 == (lyd_node *)0x0) {
        return (lyd_node *)0x0;
      }
      do {
        free((void *)pp._8_8_);
        local_e0 = (lys_node *)0x0;
        pp.schema._0_4_ = 0;
        pp.len = 0;
        pp._12_4_ = 0;
        while (llval_len != 0) {
          pp.schema._0_4_ = (int)pp.schema + 1;
          pp._8_8_ = ly_realloc((void *)pp._8_8_,(long)(int)pp.schema * 0x30);
          if ((void *)pp._8_8_ == (void *)0x0) {
            ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "resolve_partial_json_data_nodeid");
            goto LAB_00119795;
          }
          mod_name_len = parse_schema_json_predicate
                                   (mod_name,(char **)(pp._8_8_ + (long)((int)pp.schema + -1) * 0x30
                                                      ),
                                    (int *)(pp._8_8_ + (long)((int)pp.schema + -1) * 0x30 + 8),
                                    (char **)(pp._8_8_ + (long)((int)pp.schema + -1) * 0x30 + 0x10),
                                    (int *)(pp._8_8_ + (long)((int)pp.schema + -1) * 0x30 + 0x18),
                                    (char **)(pp._8_8_ + (long)((int)pp.schema + -1) * 0x30 + 0x20),
                                    (int *)(pp._8_8_ + (long)((int)pp.schema + -1) * 0x30 + 0x28),
                                    &llval_len);
          if (mod_name_len < 1) {
            ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)*mod_name,
                    mod_name);
            goto LAB_00119795;
          }
          mod_name = mod_name + mod_name_len;
          local_80 = mod_name_len + local_80;
        }
        sparent = (lys_node *)0x0;
        if ((plStack_28 == (lyd_node *)0x0) || (plStack_28->parent == (lyd_node *)0x0)) {
          local_f0 = (lys_node *)0x0;
        }
        else {
          local_f0 = plStack_28->parent->schema;
        }
LAB_00118ba2:
        do {
          sparent = lys_getnext(sparent,local_f0,(lys_module *)ctx,0);
          if (sparent == (lys_node *)0x0) break;
          if ((local_f0 != (lys_node *)0x0) &&
             ((local_f0->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN)) {
            if ((parsed_local._4_4_ & 4) == 0) {
              plVar3 = lys_parent(sparent);
              if (plVar3->nodetype == LYS_OUTPUT) goto LAB_00118ba2;
            }
            else {
              plVar3 = lys_parent(sparent);
              if (plVar3->nodetype == LYS_INPUT) goto LAB_00118ba2;
            }
          }
          iVar2 = schema_nodeid_siblingcheck
                            (sparent,(lys_module *)ctx,name,is_relative,data_val,
                             list_instance_position);
        } while (iVar2 != 0);
        if (sparent == (lys_node *)0x0) {
          free((void *)pp._8_8_);
          return (lyd_node *)llist;
        }
        local_e0 = sparent;
        if (((*mod_name == '\0') && ((int)pp.schema == 0)) && (sparent->nodetype == LYS_LEAFLIST)) {
          pp.schema._0_4_ = 1;
          pp._8_8_ = calloc(1,0x30);
          if ((void *)pp._8_8_ == (void *)0x0) {
            ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "resolve_partial_json_data_nodeid");
            goto LAB_00119795;
          }
          *(char **)(pp._8_8_ + 0x10) = ".";
          *(undefined4 *)(pp._8_8_ + 0x18) = 1;
          if (start_local == (lyd_node *)0x0) {
            local_f8 = (lyd_node *)0x1eea57;
          }
          else {
            local_f8 = start_local;
          }
          *(lyd_node **)(pp._8_8_ + 0x20) = local_f8;
          sVar4 = strlen(*(char **)(pp._8_8_ + 0x20));
          *(int *)(pp._8_8_ + 0x28) = (int)sVar4;
        }
        if ((sparent->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          if (sparent->nodetype == LYS_LIST) {
            if ((int)pp.schema == 0) {
              return (lyd_node *)llist;
            }
            pp.pred = (anon_struct_48_6_89480d8a *)sparent;
            ppuVar6 = __ctype_b_loc();
            if (((*ppuVar6)[(int)**(char **)(pp._8_8_ + 0x10)] & 0x800) == 0) {
              if ((int)(uint)(byte)(pp.pred)->field_0x1e < (int)pp.schema) {
                ly_vlog(ctx_00,LYE_PATH_PREDTOOMANY,LY_VLOG_NONE,(void *)0x0);
                goto LAB_00119795;
              }
              if ((int)pp.schema < (int)(uint)(byte)(pp.pred)->field_0x1e) {
                ly_vlog(ctx_00,LYE_PATH_MISSKEY,LY_VLOG_NONE,(void *)0x0,
                        **(undefined8 **)(*(long *)&pp.pred[2].val_len + (long)(int)pp.schema * 8));
                goto LAB_00119795;
              }
              for (mod_name_len = 0; mod_name_len < (int)pp.schema; mod_name_len = mod_name_len + 1)
              {
                if ((*(int *)(*(long *)(*(long *)&pp.pred[2].val_len + (long)mod_name_len * 8) +
                             0x80) == 7) &&
                   (pcVar5 = strnchr(*(char **)(pp._8_8_ + (long)mod_name_len * 0x30 + 0x20),0x3a,
                                     *(uint *)(pp._8_8_ + (long)mod_name_len * 0x30 + 0x28)),
                   pcVar5 == (char *)0x0)) {
                  ly_vlog(ctx_00,LYE_PATH_INIDENTREF,LY_VLOG_LYS,
                          *(void **)(*(long *)&pp.pred[2].val_len + (long)mod_name_len * 8),
                          (ulong)*(uint *)(pp._8_8_ + (long)mod_name_len * 0x30 + 0x28),
                          *(undefined8 *)(pp._8_8_ + (long)mod_name_len * 0x30 + 0x20));
                  goto LAB_00119795;
                }
              }
            }
          }
          else if (pp._8_8_ != 0) {
            ly_vlog(ctx_00,LYE_PATH_PREDTOOMANY,LY_VLOG_NONE,(void *)0x0);
            goto LAB_00119795;
          }
        }
        else {
          if (1 < (int)pp.schema) {
            ly_vlog(ctx_00,LYE_PATH_PREDTOOMANY,LY_VLOG_NONE,(void *)0x0);
            goto LAB_00119795;
          }
          if ((int)pp.schema != 0) {
            if ((**(char **)(pp._8_8_ + 0x10) != '.') || (*(int *)(pp._8_8_ + 0x18) != 1)) {
              ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                      (ulong)(uint)(int)**(char **)(pp._8_8_ + 0x10),
                      *(undefined8 *)(pp._8_8_ + 0x10));
              goto LAB_00119795;
            }
            if ((*(int *)&sparent[1].ref == 7) &&
               (pcVar5 = strnchr(*(char **)(pp._8_8_ + 0x20),0x3a,*(uint *)(pp._8_8_ + 0x28)),
               pcVar5 == (char *)0x0)) {
              ly_vlog(ctx_00,LYE_PATH_INIDENTREF,LY_VLOG_LYS,sparent,
                      (ulong)*(uint *)(pp._8_8_ + 0x28),*(undefined8 *)(pp._8_8_ + 0x20));
              goto LAB_00119795;
            }
          }
        }
        if ((((plStack_28->parent == (lyd_node *)0x0) ||
             (plStack_28->parent->ht == (hash_table *)0x0)) ||
            ((local_e0->nodetype == LYS_LIST && (local_e0->padding[2] == '\0')))) ||
           ((local_e0->nodetype == LYS_LEAFLIST && ((local_e0->flags & 1) == 0)))) {
          last_parsed = 0;
          for (last_match = plStack_28; last_match != (lyd_node *)0x0; last_match = last_match->next
              ) {
            plVar3 = lys_parent(last_match->schema);
            if (plVar3 != (lys_node *)0x0) {
              if ((parsed_local._4_4_ & 4) == 0) {
                plVar3 = lys_parent(last_match->schema);
                if (plVar3->nodetype == LYS_OUTPUT) {
                  ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                         "Provided data tree includes some RPC output nodes (%s).",
                         last_match->schema->name);
                  goto LAB_00119795;
                }
              }
              else {
                plVar3 = lys_parent(last_match->schema);
                if (plVar3->nodetype == LYS_INPUT) {
                  ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                         "Provided data tree includes some RPC input nodes (%s).",
                         last_match->schema->name);
                  goto LAB_00119795;
                }
              }
            }
            if (last_match->schema == sparent) {
              if (sparent->nodetype == LYS_LEAFLIST) {
                if ((sparent->flags & 2) == 0) {
                  _ret = (char *)0x0;
                  sibling._4_4_ = 0;
                  if (pp._8_8_ != 0) {
                    _ret = *(char **)(pp._8_8_ + 0x20);
                    sibling._4_4_ = *(int *)(pp._8_8_ + 0x28);
                  }
                  if (((_ret == (char *)0x0) || (pcVar5 = strchr(_ret,0x3a), pcVar5 != (char *)0x0))
                     || (((ulong)last_match[1].schema & 7) == 0)) {
LAB_0011938e:
                    llval = (char *)last_match->ht;
                  }
                  else {
                    phVar1 = last_match->ht;
                    plVar7 = lyd_node_module(last_match);
                    pcVar5 = plVar7->name;
                    plVar7 = lyd_node_module(last_match);
                    sVar4 = strlen(plVar7->name);
                    iVar2 = strncmp((char *)phVar1,pcVar5,sVar4);
                    if (iVar2 != 0) goto LAB_0011938e;
                    phVar1 = last_match->ht;
                    plVar7 = lyd_node_module(last_match);
                    sVar4 = strlen(plVar7->name);
                    if (*(char *)((long)&phVar1->used + sVar4) != ':') goto LAB_0011938e;
                    phVar1 = last_match->ht;
                    plVar7 = lyd_node_module(last_match);
                    sVar4 = strlen(plVar7->name);
                    llval = (char *)((long)&phVar1->used + sVar4 + 1);
                  }
                  if ((((_ret != (char *)0x0) || (llval == (char *)0x0)) || (*llval == '\0')) &&
                     ((_ret == (char *)0x0 ||
                      ((iVar2 = strncmp(_ret,llval,(long)sibling._4_4_), iVar2 == 0 &&
                       (llval[sibling._4_4_] == '\0')))))) break;
                }
              }
              else {
                if (sparent->nodetype != LYS_LIST) break;
                last_parsed = last_parsed + 1;
                pp_01._12_4_ = pp.schema._4_4_;
                pp_01.len = (int)pp.schema;
                pp_01.schema = local_e0;
                pp_01.pred._0_4_ = pp.len;
                pp_01.pred._4_4_ = pp._12_4_;
                nam_len = resolve_partial_json_data_list_predicate(pp_01,last_match,last_parsed);
                if (nam_len == -1) goto LAB_00119795;
                if (nam_len != 1) break;
              }
            }
          }
        }
        else {
          pp_00._12_4_ = pp.schema._4_4_;
          pp_00.len = (int)pp.schema;
          pp_00.schema = local_e0;
          pp_00.pred._0_4_ = pp.len;
          pp_00.pred._4_4_ = pp._12_4_;
          last_match = resolve_json_data_node_hash(plStack_28->parent,pp_00);
        }
        if (last_match == (lyd_node *)0x0) {
          free((void *)pp._8_8_);
          return (lyd_node *)llist;
        }
        *(int *)id = local_80 + *(int *)id;
        llist = (lyd_node_leaf_list *)last_match;
        ctx = (ly_ctx *)lyd_node_module(last_match);
        if (*mod_name == '\0') {
          free((void *)pp._8_8_);
          return last_match;
        }
        if ((sparent->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
          ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)*mod_name,
                  mod_name);
          goto LAB_00119795;
        }
        if (last_match->child == (lyd_node *)0x0) {
          free((void *)pp._8_8_);
          return last_match;
        }
        plStack_28 = last_match->child;
        local_80 = parse_schema_nodeid(mod_name,&name,&is_relative,&data_val,&list_instance_position
                                       ,&has_predicate,&llval_len,(int *)0x0,0);
        mod_name_len = local_80;
        if (local_80 < 1) goto code_r0x00119599;
        mod_name = mod_name + local_80;
      } while( true );
    }
    ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)mod_name[-mod_name_len],mod_name + -mod_name_len);
  }
LAB_00119795:
  id[0] = -1;
  id[1] = -1;
  id[2] = -1;
  id[3] = -1;
  free((void *)pp._8_8_);
  return (lyd_node *)0x0;
code_r0x00119599:
  ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)mod_name[-local_80],
          mod_name + -local_80);
  goto LAB_00119795;
}

Assistant:

struct lyd_node *
resolve_partial_json_data_nodeid(const char *nodeid, const char *llist_value, struct lyd_node *start, int options,
                                 int *parsed)
{
    const char *id, *mod_name, *name, *data_val, *llval;
    int r, ret, mod_name_len, nam_len, is_relative = -1, list_instance_position;
    int has_predicate, last_parsed = 0, llval_len;
    struct lyd_node *sibling, *last_match = NULL;
    struct lyd_node_leaf_list *llist;
    const struct lys_module *prev_mod;
    struct ly_ctx *ctx;
    const struct lys_node *ssibling, *sparent;
    struct lys_node_list *slist;
    struct parsed_pred pp;

    assert(nodeid && start && parsed);

    memset(&pp, 0, sizeof pp);
    ctx = start->schema->module->ctx;
    id = nodeid;

    /* parse first nodeid in case it is yang-data extension */
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        goto error;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            goto error;
        }
        id += r;
        last_parsed = r;
    } else {
        is_relative = -1;
    }

    /* parse first nodeid */
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        goto error;
    }
    id += r;
    /* add it to parsed only after the data node was actually found */
    last_parsed += r;

    if (is_relative) {
        prev_mod = lyd_node_module(start);
        start = (start->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF)) ? start->child : NULL;
    } else {
        for (; start->parent; start = start->parent);
        prev_mod = lyd_node_module(start);
    }
    if (!start) {
        /* there are no siblings to search */
        return NULL;
    }

    /* do not duplicate code, use predicate parsing from the loop */
    goto parse_predicates;

    while (1) {
        /* find the correct schema node first */
        ssibling = NULL;
        sparent = (start && start->parent) ? start->parent->schema : NULL;
        while ((ssibling = lys_getnext(ssibling, sparent, prev_mod, 0))) {
            /* skip invalid input/output nodes */
            if (sparent && (sparent->nodetype & (LYS_RPC | LYS_ACTION))) {
                if (options & LYD_PATH_OPT_OUTPUT) {
                    if (lys_parent(ssibling)->nodetype == LYS_INPUT) {
                        continue;
                    }
                } else {
                    if (lys_parent(ssibling)->nodetype == LYS_OUTPUT) {
                        continue;
                    }
                }
            }

            if (!schema_nodeid_siblingcheck(ssibling, prev_mod, mod_name, mod_name_len, name, nam_len)) {
                break;
            }
        }
        if (!ssibling) {
            /* there is not even such a schema node */
            free(pp.pred);
            return last_match;
        }
        pp.schema = ssibling;

        /* unify leaf-list value - it is possible to specify last-node value as both a predicate or parameter if
         * is a leaf-list, unify both cases and the value will in both cases be in the predicate structure */
        if (!id[0] && !pp.len && (ssibling->nodetype == LYS_LEAFLIST)) {
            pp.len = 1;
            pp.pred = calloc(1, sizeof *pp.pred);
            LY_CHECK_ERR_GOTO(!pp.pred, LOGMEM(ctx), error);

            pp.pred[0].name = ".";
            pp.pred[0].nam_len = 1;
            pp.pred[0].value = (llist_value ? llist_value : "");
            pp.pred[0].val_len = strlen(pp.pred[0].value);
        }

        if (ssibling->nodetype & (LYS_LEAFLIST | LYS_LEAF)) {
            /* check leaf/leaf-list predicate */
            if (pp.len > 1) {
                LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
                goto error;
            } else if (pp.len) {
                if ((pp.pred[0].name[0] != '.') || (pp.pred[0].nam_len != 1)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, pp.pred[0].name[0], pp.pred[0].name);
                    goto error;
                }
                if ((((struct lys_node_leaf *)ssibling)->type.base == LY_TYPE_IDENT) && !strnchr(pp.pred[0].value, ':', pp.pred[0].val_len)) {
                    LOGVAL(ctx, LYE_PATH_INIDENTREF, LY_VLOG_LYS, ssibling, pp.pred[0].val_len, pp.pred[0].value);
                    goto error;
                }
            }
        } else if (ssibling->nodetype == LYS_LIST) {
            /* list should have predicates for all the keys or position */
            slist = (struct lys_node_list *)ssibling;
            if (!pp.len) {
                /* none match */
                return last_match;
            } else if (!isdigit(pp.pred[0].name[0])) {
                /* list predicate is not a position, so there must be all the keys */
                if (pp.len > slist->keys_size) {
                    LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
                    goto error;
                } else if (pp.len < slist->keys_size) {
                    LOGVAL(ctx, LYE_PATH_MISSKEY, LY_VLOG_NONE, NULL, slist->keys[pp.len]->name);
                    goto error;
                }
                /* check that all identityrefs have module name, otherwise the hash of the list instance will never match!! */
                for (r = 0; r < pp.len; ++r) {
                    if ((slist->keys[r]->type.base == LY_TYPE_IDENT) && !strnchr(pp.pred[r].value, ':', pp.pred[r].val_len)) {
                        LOGVAL(ctx, LYE_PATH_INIDENTREF, LY_VLOG_LYS, slist->keys[r], pp.pred[r].val_len, pp.pred[r].value);
                        goto error;
                    }
                }
            }
        } else if (pp.pred) {
            /* no other nodes allow predicates */
            LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
            goto error;
        }

#ifdef LY_ENABLED_CACHE
        /* we will not be matching keyless lists or state leaf-lists this way */
        if (start->parent && start->parent->ht && ((pp.schema->nodetype != LYS_LIST) || ((struct lys_node_list *)pp.schema)->keys_size)
                && ((pp.schema->nodetype != LYS_LEAFLIST) || (pp.schema->flags & LYS_CONFIG_W))) {
            sibling = resolve_json_data_node_hash(start->parent, pp);
        } else
#endif
        {
            list_instance_position = 0;
            LY_TREE_FOR(start, sibling) {
                /* RPC/action data check, return simply invalid argument, because the data tree is invalid */
                if (lys_parent(sibling->schema)) {
                    if (options & LYD_PATH_OPT_OUTPUT) {
                        if (lys_parent(sibling->schema)->nodetype == LYS_INPUT) {
                            LOGERR(ctx, LY_EINVAL, "Provided data tree includes some RPC input nodes (%s).", sibling->schema->name);
                            goto error;
                        }
                    } else {
                        if (lys_parent(sibling->schema)->nodetype == LYS_OUTPUT) {
                            LOGERR(ctx, LY_EINVAL, "Provided data tree includes some RPC output nodes (%s).", sibling->schema->name);
                            goto error;
                        }
                    }
                }

                if (sibling->schema != ssibling) {
                    /* wrong schema node */
                    continue;
                }

                /* leaf-list, did we find it with the correct value or not? */
                if (ssibling->nodetype == LYS_LEAFLIST) {
                    if (ssibling->flags & LYS_CONFIG_R) {
                        /* state leaf-lists will never match */
                        continue;
                    }

                    llist = (struct lyd_node_leaf_list *)sibling;

                    /* get the expected leaf-list value */
                    llval = NULL;
                    llval_len = 0;
                    if (pp.pred) {
                        /* it was already checked that it is correct */
                        llval = pp.pred[0].value;
                        llval_len = pp.pred[0].val_len;

                    }

                    /* make value canonical (remove module name prefix) unless it was specified with it */
                    if (llval && !strchr(llval, ':') && (llist->value_type & LY_TYPE_IDENT)
                            && !strncmp(llist->value_str, lyd_node_module(sibling)->name, strlen(lyd_node_module(sibling)->name))
                            && (llist->value_str[strlen(lyd_node_module(sibling)->name)] == ':')) {
                        data_val = llist->value_str + strlen(lyd_node_module(sibling)->name) + 1;
                    } else {
                        data_val = llist->value_str;
                    }

                    if ((!llval && data_val && data_val[0]) || (llval && (strncmp(llval, data_val, llval_len)
                            || data_val[llval_len]))) {
                        continue;
                    }

                } else if (ssibling->nodetype == LYS_LIST) {
                    /* list, we likely need predicates'n'stuff then, but if without a predicate, we are always creating it */
                    ++list_instance_position;
                    ret = resolve_partial_json_data_list_predicate(pp, sibling, list_instance_position);
                    if (ret == -1) {
                        goto error;
                    } else if (ret == 1) {
                        /* this list instance does not match */
                        continue;
                    }
                }

                break;
            }
        }

        /* no match, return last match */
        if (!sibling) {
            free(pp.pred);
            return last_match;
        }

        /* we found a next matching node */
        *parsed += last_parsed;
        last_match = sibling;
        prev_mod = lyd_node_module(sibling);

        /* the result node? */
        if (!id[0]) {
            free(pp.pred);
            return last_match;
        }

        /* move down the tree, if possible, and continue */
        if (ssibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            /* there can be no children even through expected, error */
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
            goto error;
        } else if (!sibling->child) {
            /* there could be some children, but are not, return what we found so far */
            free(pp.pred);
            return last_match;
        }
        start = sibling->child;

        /* parse nodeid */
        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            goto error;
        }
        id += r;
        last_parsed = r;

parse_predicates:
        /* parse all the predicates */
        free(pp.pred);
        pp.schema = NULL;
        pp.len = 0;
        pp.pred = NULL;
        while (has_predicate) {
            ++pp.len;
            pp.pred = ly_realloc(pp.pred, pp.len * sizeof *pp.pred);
            LY_CHECK_ERR_GOTO(!pp.pred, LOGMEM(ctx), error);
            if ((r = parse_schema_json_predicate(id, &pp.pred[pp.len - 1].mod_name, &pp.pred[pp.len - 1].mod_name_len,
                                                 &pp.pred[pp.len - 1].name, &pp.pred[pp.len - 1].nam_len, &pp.pred[pp.len - 1].value,
                                                 &pp.pred[pp.len - 1].val_len, &has_predicate)) < 1) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                goto error;
            }

            id += r;
            last_parsed += r;
        }
    }

error:
    *parsed = -1;
    free(pp.pred);
    return NULL;
}